

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O1

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  double b;
  double a;
  double sigma;
  double mu;
  delim_c local_74;
  delim_c local_73;
  delim_c local_72;
  delim_c local_71;
  result_type_conflict2 local_70;
  result_type_conflict2 local_68;
  result_type_conflict2 local_60;
  result_type_conflict2 local_58;
  param_type local_50;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_50.mu_ = (result_type_conflict2)CONCAT71(local_50.mu_._1_7_,0x28);
  pbVar2 = utility::operator>>(in,(delim_c *)&local_50);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_71.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_71);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_72.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_72);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_73.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_73);
  piVar3 = std::istream::_M_extract<double>((double *)pbVar2);
  local_74.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_74);
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    local_50.mu_ = local_58;
    local_50.sigma_ = local_60;
    local_50.a_ = local_68;
    local_50.b_ = local_70;
    local_50.Phi_a._0_4_ = 0;
    local_50.Phi_a._4_4_ = 0;
    local_50.Phi_b._0_4_ = 0;
    local_50.Phi_b._4_4_ = 0x3ff00000;
    truncated_normal_dist<double>::param_type::update_Phi(&local_50);
    P->Phi_a = (result_type_conflict2)CONCAT44(local_50.Phi_a._4_4_,local_50.Phi_a._0_4_);
    P->Phi_b = (result_type_conflict2)CONCAT44(local_50.Phi_b._4_4_,local_50.Phi_b._0_4_);
    P->a_ = local_50.a_;
    P->b_ = local_50.b_;
    P->mu_ = local_50.mu_;
    P->sigma_ = local_50.sigma_;
  }
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, param_type &P) {
        float_t mu, sigma, a, b;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> mu >> utility::delim(' ') >> sigma >>
            utility::delim(' ') >> a >> utility::delim(' ') >> b >> utility::delim(')');
        if (in)
          P = param_type(mu, sigma, a, b);
        in.flags(flags);
        return in;
      }